

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O2

size_t xemmai::t_type_of<xemmai::t_bytes>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *ptVar1;
  intptr_t iVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar3;
  
  f_check<long>(a_stack[2].super_t_pointer.v_p,L"index");
  ptVar1 = a_stack[2].super_t_pointer.v_p;
  paVar3 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
  if (ptVar1 < (t_object *)0x5) {
    paVar3 = &a_stack[2].field_0;
  }
  iVar2 = t_bytes::f_get_at((t_bytes *)a_this->v_data,paVar3->v_integer);
  (a_stack->super_t_pointer).v_p = (t_object *)0x3;
  (a_stack->field_0).v_integer = iVar2;
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_bytes>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_bytes>().f_get_at(f_as<intptr_t>(a_stack[2]));
	return -1;
}